

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_config.hpp
# Opt level: O2

void __thiscall Catch::Config::~Config(Config *this)

{
  (this->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__Config_001718d0;
  std::ios::rdbuf((streambuf *)(&this->m_os + *(long *)(*(long *)&this->m_os + -0x18)));
  Stream::release(&this->m_stream);
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            (&(this->m_testSpec).m_filters);
  std::ios_base::~ios_base((ios_base *)&this->field_0xe8);
  ConfigData::~ConfigData(&this->m_data);
  return;
}

Assistant:

virtual ~Config() {
            m_os.rdbuf( Catch::cout().rdbuf() );
            m_stream.release();
        }